

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

color_quad_u8 __thiscall
crnlib::rg_etc1::etc1_solution_coordinates::get_scaled_color(etc1_solution_coordinates *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *in_RSI;
  uint uVar4;
  
  bVar1 = *in_RSI;
  if (in_RSI[8] == 1) {
    uVar4 = (uint)bVar1 << 4 | (uint)bVar1;
    uVar2 = (uint)in_RSI[1] << 4 | (uint)in_RSI[1];
    uVar3 = (uint)in_RSI[2] << 4 | (uint)in_RSI[2];
  }
  else {
    uVar4 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
    uVar2 = (uint)in_RSI[1] << 3 | (uint)(in_RSI[1] >> 2);
    uVar3 = (uint)in_RSI[2] << 3 | (uint)(in_RSI[2] >> 2);
  }
  if (0xfe < uVar4) {
    uVar4 = 0xff;
  }
  if (0xfe < uVar2) {
    uVar2 = 0xff;
  }
  (this->m_unscaled_color).field_0.field_0.r = (component_t)uVar4;
  uVar4 = 0xff;
  if (uVar3 < 0xff) {
    uVar4 = uVar3;
  }
  (this->m_unscaled_color).field_0.field_0.g = (component_t)uVar2;
  (this->m_unscaled_color).field_0.field_0.b = (component_t)uVar4;
  (this->m_unscaled_color).field_0.field_0.a = 0xff;
  return (color_quad_u8)SUB84(this,0);
}

Assistant:

inline color_quad_u8 get_scaled_color() const {
    int br, bg, bb;
    if (m_color4) {
      br = m_unscaled_color.r | (m_unscaled_color.r << 4);
      bg = m_unscaled_color.g | (m_unscaled_color.g << 4);
      bb = m_unscaled_color.b | (m_unscaled_color.b << 4);
    } else {
      br = (m_unscaled_color.r >> 2) | (m_unscaled_color.r << 3);
      bg = (m_unscaled_color.g >> 2) | (m_unscaled_color.g << 3);
      bb = (m_unscaled_color.b >> 2) | (m_unscaled_color.b << 3);
    }
    return color_quad_u8(br, bg, bb);
  }